

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

CcsContext __thiscall ccs::CcsDomain::build(CcsDomain *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_> *in_RSI;
  CcsContext CVar1;
  shared_ptr<const_ccs::Node> local_28;
  CcsDomain *this_local;
  
  this_local = this;
  std::unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>::operator->(in_RSI);
  DagBuilder::root((DagBuilder *)&local_28);
  CcsContext::CcsContext((CcsContext *)this,&local_28);
  std::shared_ptr<const_ccs::Node>::~shared_ptr(&local_28);
  CVar1.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  CVar1.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CcsContext)
         CVar1.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CcsContext CcsDomain::build() {
  return CcsContext(dag->root());
}